

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O0

void __thiscall BitSet::BitSet(BitSet *this,unsigned_long *bits_,int nlongs)

{
  int in_EDX;
  long in_RSI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  reference rVar1;
  int i;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar2;
  size_type_conflict in_stack_ffffffffffffff98;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffa0;
  vector<bool,_std::allocator<bool>_> *this_00;
  reference local_38;
  uint local_28;
  int local_14;
  long local_10;
  
  this_00 = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<bool>::allocator((allocator<bool> *)0x28fa3e);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::allocator<bool>::~allocator((allocator<bool> *)0x28fa5e);
  for (local_28 = 0; (int)local_28 < local_14 * 0x20; local_28 = local_28 + 1) {
    bVar2 = -((*(uint *)(local_10 + (long)((int)local_28 >> 5) * 8) >> (local_28 & 0x1f) & 1) != 0);
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type_conflict)in_RDI)
    ;
    local_38 = rVar1;
    std::_Bit_reference::operator=(&local_38,(bool)(bVar2 & 1));
  }
  return;
}

Assistant:

BitSet::BitSet(const unsigned long* bits_,int nlongs)
	: storage(nlongs*32)
{
	for (int i=0;i<nlongs*32;i++) {
		storage[i] = (bits_[i>>5] & (1UL << (i&31))) ? true : false;
	}
}